

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCoreRandom.hpp
# Opt level: O0

void TasDREAM::genGaussianSamples
               (vector<double,_std::allocator<double>_> *means,
               vector<double,_std::allocator<double>_> *deviations,int num_samples,
               vector<double,_std::allocator<double>_> *x,function<double_()> *get_random01)

{
  double dVar1;
  function<double_()> *pfVar2;
  vector<double,_std::allocator<double>_> *this;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  runtime_error *this_00;
  double *__first;
  reference pdVar6;
  reference pdVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_a8;
  double local_a0;
  double s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  const_iterator im;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  iterator ix;
  double local_48 [3];
  function<double_()> *local_30;
  function<double_()> *get_random01_local;
  vector<double,_std::allocator<double>_> *x_local;
  vector<double,_std::allocator<double>_> *pvStack_18;
  int num_samples_local;
  vector<double,_std::allocator<double>_> *deviations_local;
  vector<double,_std::allocator<double>_> *means_local;
  
  local_30 = get_random01;
  get_random01_local = (function<double_()> *)x;
  x_local._4_4_ = num_samples;
  pvStack_18 = deviations;
  deviations_local = means;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(means);
  sVar5 = std::vector<double,_std::allocator<double>_>::size(pvStack_18);
  if (sVar4 == sVar5) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)get_random01_local);
    sVar5 = std::vector<double,_std::allocator<double>_>::size(deviations_local);
    pfVar2 = get_random01_local;
    if (sVar4 != sVar5 * (long)x_local._4_4_) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size(deviations_local);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)pfVar2,sVar4 * (long)x_local._4_4_);
    }
    __first = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)get_random01_local);
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)get_random01_local);
    local_48[0] = 0.0;
    std::fill_n<double*,unsigned_long,double>(__first,sVar4,local_48);
    pfVar2 = get_random01_local;
    std::function<double_()>::function((function<double_()> *)&ix,get_random01);
    applyGaussianUpdate((vector<double,_std::allocator<double>_> *)pfVar2,1.0,
                        (function<double_()> *)&ix);
    std::function<double_()>::~function((function<double_()> *)&ix);
    local_70._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)get_random01_local);
    while( true ) {
      im._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)get_random01_local);
      bVar3 = __gnu_cxx::operator!=
                        (&local_70,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&im);
      if (!bVar3) break;
      __range2 = (vector<double,_std::allocator<double>_> *)
                 std::vector<double,_std::allocator<double>_>::begin(deviations_local);
      this = pvStack_18;
      __end2 = std::vector<double,_std::allocator<double>_>::begin(pvStack_18);
      s = (double)std::vector<double,_std::allocator<double>_>::end(this);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)&s), bVar3) {
        pdVar6 = __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end2);
        dVar1 = *pdVar6;
        local_a0 = dVar1;
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_70);
        *pdVar7 = dVar1 * *pdVar7;
        local_a8 = __gnu_cxx::
                   __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                   ::operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)&__range2,0);
        pdVar6 = __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_a8);
        dVar1 = *pdVar6;
        local_b0 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator++(&local_70,0);
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_b0);
        *pdVar7 = dVar1 + *pdVar7;
        __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
        ::operator++(&__end2);
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void genGaussianSamples(const std::vector<double> &means, const std::vector<double> &deviations,
                               int num_samples, std::vector<double> &x, std::function<double(void)> get_random01 = tsgCoreUniform01){
    if (means.size() != deviations.size()) throw std::runtime_error("ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    if (x.size() != means.size() * num_samples) x.resize(means.size() * num_samples);

    std::fill_n(x.data(), x.size(), 0.0);
    applyGaussianUpdate(x, 1.0, get_random01);

    auto ix = x.begin();
    while(ix != x.end()){
        auto im = means.begin();
        for(auto s : deviations){
            *ix *= s;
            *ix++ += *im++;
        }
    }
}